

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O0

int mbedtls_camellia_crypt_cfb128
              (mbedtls_camellia_context *ctx,int mode,size_t length,size_t *iv_off,uchar *iv,
              uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  ulong local_50;
  size_t n;
  byte *pbStack_40;
  int c;
  uchar *input_local;
  uchar *iv_local;
  size_t *iv_off_local;
  size_t length_local;
  int mode_local;
  mbedtls_camellia_context *ctx_local;
  
  local_50 = *iv_off;
  if (local_50 < 0x10) {
    pbStack_40 = input;
    iv_off_local = (size_t *)length;
    if (mode == 0) {
      while (iv_off_local != (size_t *)0x0) {
        if (local_50 == 0) {
          mbedtls_camellia_crypt_ecb(ctx,1,iv,iv);
        }
        bVar1 = *pbStack_40;
        *output = bVar1 ^ iv[local_50];
        iv[local_50] = bVar1;
        local_50 = local_50 + 1 & 0xf;
        output = output + 1;
        pbStack_40 = pbStack_40 + 1;
        iv_off_local = (size_t *)((long)iv_off_local + -1);
      }
    }
    else {
      while (iv_off_local != (size_t *)0x0) {
        if (local_50 == 0) {
          mbedtls_camellia_crypt_ecb(ctx,1,iv,iv);
        }
        bVar1 = iv[local_50];
        bVar2 = *pbStack_40;
        *output = bVar1 ^ bVar2;
        iv[local_50] = bVar1 ^ bVar2;
        local_50 = local_50 + 1 & 0xf;
        output = output + 1;
        pbStack_40 = pbStack_40 + 1;
        iv_off_local = (size_t *)((long)iv_off_local + -1);
      }
    }
    *iv_off = local_50;
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = -0x24;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_camellia_crypt_cfb128( mbedtls_camellia_context *ctx,
                       int mode,
                       size_t length,
                       size_t *iv_off,
                       unsigned char iv[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c;
    size_t n;
    CAMELLIA_VALIDATE_RET( ctx != NULL );
    CAMELLIA_VALIDATE_RET( mode == MBEDTLS_CAMELLIA_ENCRYPT ||
                           mode == MBEDTLS_CAMELLIA_DECRYPT );
    CAMELLIA_VALIDATE_RET( iv     != NULL );
    CAMELLIA_VALIDATE_RET( iv_off != NULL );
    CAMELLIA_VALIDATE_RET( length == 0 || input  != NULL );
    CAMELLIA_VALIDATE_RET( length == 0 || output != NULL );

    n = *iv_off;
    if( n >= 16 )
        return( MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA );

    if( mode == MBEDTLS_CAMELLIA_DECRYPT )
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, iv, iv );

            c = *input++;
            *output++ = (unsigned char)( c ^ iv[n] );
            iv[n] = (unsigned char) c;

            n = ( n + 1 ) & 0x0F;
        }
    }
    else
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, iv, iv );

            iv[n] = *output++ = (unsigned char)( iv[n] ^ *input++ );

            n = ( n + 1 ) & 0x0F;
        }
    }

    *iv_off = n;

    return( 0 );
}